

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_array.cpp
# Opt level: O2

void __thiscall
SparseArray_TwoArgCtor_Test<unsigned_short>::~SparseArray_TwoArgCtor_Test
          (SparseArray_TwoArgCtor_Test<unsigned_short> *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TYPED_TEST (SparseArray, TwoArgCtor) {
    using array_type = sparse_array<with_default_ctor, TypeParam>;
    constexpr std::array<unsigned const, 3> indices{{0U, 2U, 4U}};
    typename std::aligned_storage_t<array_type::size_bytes (indices.size ()), alignof (array_type)>
        storage;
    array_type * arrp = new (&storage) array_type{indices.begin (), indices.end ()};
    array_type & arr = *arrp;

    std::bitset<256> valid_indices;
    valid_indices.reset ();
    for (unsigned const ind : indices) {
        valid_indices.set (ind);
    }

    for (auto ctr = 0U; ctr < valid_indices.size (); ++ctr) {
        EXPECT_EQ (arr.has_index (ctr), valid_indices.test (ctr));
    }
    EXPECT_EQ (arr[0].a, 37);
    EXPECT_EQ (arr[2].a, 37);
    EXPECT_EQ (arr[4].a, 37);
}